

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ru_vine_swap.h
# Opt level: O3

bool __thiscall
Gudhi::persistence_matrix::
RU_vine_swap<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_true,_false>_>_>
::_positive_negative_vine_swap
          (RU_vine_swap<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_true,_false>_>_>
           *this,Index columnIndex)

{
  size_type sVar1;
  node_ptr plVar2;
  node_ptr plVar3;
  long *plVar4;
  long lVar5;
  __node_base_ptr p_Var6;
  ulong uVar7;
  iterator iVar8;
  ulong uVar9;
  node_ptr next;
  key_type *pkVar10;
  pointer pEVar11;
  pointer p;
  long *plVar12;
  ulong uVar13;
  key_type local_24;
  
  uVar7 = (ulong)columnIndex;
  iVar8 = std::
          _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                  *)this,&local_24);
  pkVar10 = (key_type *)
            ((long)iVar8.
                   super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>.
                   _M_cur + 0xc);
  if (iVar8.super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>._M_cur ==
      (__node_type *)0x0) {
    pkVar10 = &local_24;
  }
  sVar1 = this[5].super_type.map_._M_h._M_bucket_count;
  pEVar11 = (pointer)(sVar1 + uVar7 * 0x28 + 0x18);
  p = pEVar11;
  do {
    p = (pointer)(p->super_Column_hook).super_type.super_type.super_list_node<void_*>.next_;
    if (p == pEVar11) goto LAB_0015da22;
    if (p == (pointer)0x0) goto LAB_0015dabb;
  } while (p->rowIndex_ !=
           *(ID_index *)(this[4].super_type.map_._M_h._M_bucket_count + (ulong)*pkVar10 * 4));
  plVar2 = (p->super_Column_hook).super_type.super_type.super_list_node<void_*>.next_;
  plVar3 = (p->super_Column_hook).super_type.super_type.super_list_node<void_*>.prev_;
  plVar3->next_ = plVar2;
  plVar2->prev_ = plVar3;
  (p->super_Column_hook).super_type.super_type.super_list_node<void_*>.next_ = (node_ptr)0x0;
  (p->super_Column_hook).super_type.super_type.super_list_node<void_*>.prev_ = (node_ptr)0x0;
  Simple_object_pool<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_true,_false>_>_>_>
  ::destroy(*(Simple_object_pool<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_true,_false>_>_>_>
              **)(sVar1 + uVar7 * 0x28 + 0x10),p);
LAB_0015da22:
  _swap_at_index(this,columnIndex);
  if (*(char *)&this[3].super_type.map_._M_h._M_before_begin._M_nxt == '\x01') {
    Base_swap<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_true,_false>_>,_Gudhi::persistence_matrix::Boundary_matrix<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_true,_false>_>_>_>
    ::_orderRows((Base_swap<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_true,_false>_>,_Gudhi::persistence_matrix::Boundary_matrix<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_true,_false>_>_>_>
                  *)&this[2].super_type.map_._M_h._M_element_count);
  }
  uVar9 = (ulong)(columnIndex + 1);
  sVar1 = this[3].super_type.map_._M_h._M_element_count;
  plVar12 = (long *)(sVar1 + uVar9 * 0x28 + 0x18);
  plVar4 = (long *)*plVar12;
  uVar13 = 0xffffffff;
  if (plVar4 != plVar12 && plVar4 != (long *)0x0) {
    lVar5 = *(long *)(sVar1 + uVar9 * 0x28 + 0x20);
    if (lVar5 == 0) {
LAB_0015dabb:
      __assert_fail("!!p","/usr/include/boost/intrusive/detail/hook_traits.hpp",0x3e,
                    "static pointer boost::intrusive::bhtraits_base<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_vine_options<Gudhi::persistence_matrix::Column_types::INTRUSIVE_LIST, true, false, true, true, false>>>, boost::intrusive::list_node<void *> *, Gudhi::persistence_matrix::Matrix<RU_vine_options<Gudhi::persistence_matrix::Column_types::INTRUSIVE_LIST, true, false, true, true, false>>::Matrix_column_tag, 1>::to_value_ptr(const node_ptr &) [T = Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_vine_options<Gudhi::persistence_matrix::Column_types::INTRUSIVE_LIST, true, false, true, true, false>>>, NodePtr = boost::intrusive::list_node<void *> *, Tag = Gudhi::persistence_matrix::Matrix<RU_vine_options<Gudhi::persistence_matrix::Column_types::INTRUSIVE_LIST, true, false, true, true, false>>::Matrix_column_tag, Type = 1]"
                   );
    }
    uVar13 = (ulong)*(uint *)(lVar5 + 0x10);
  }
  p_Var6 = this[5].super_type.map_._M_h._M_single_bucket;
  if (uVar13 < (ulong)((long)this[6].super_type.map_._M_h._M_buckets - (long)p_Var6 >> 2)) {
    *(Index *)((long)&p_Var6->_M_nxt + uVar13 * 4) = columnIndex;
    *(undefined4 *)((long)&p_Var6->_M_nxt + uVar9 * 4) =
         *(undefined4 *)((long)&p_Var6->_M_nxt + uVar7 * 4);
    *(undefined4 *)((long)&p_Var6->_M_nxt + uVar7 * 4) = 0xffffffff;
    return true;
  }
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
}

Assistant:

inline bool RU_vine_swap<Master_matrix>::_positive_negative_vine_swap(Index columnIndex) 
{
  _matrix()->mirrorMatrixU_.zero_entry(columnIndex, _get_row_id_from_position(columnIndex + 1));

  _swap_at_index(columnIndex);
  _positive_negative_transpose(columnIndex);

  return true;
}